

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

Ifn_Ntk_t * Ifn_NtkParse(char *pStr)

{
  int iVar1;
  Ifn_Ntk_t *p_00;
  Ifn_Ntk_t *p;
  char *pStr_local;
  
  p_00 = (Ifn_Ntk_t *)calloc(1,0x3730);
  iVar1 = Ifn_ManStrType2(pStr);
  if (iVar1 == 0) {
    iVar1 = Ifn_NtkParseInt(pStr,p_00);
    if (iVar1 == 0) {
      if (p_00 != (Ifn_Ntk_t *)0x0) {
        free(p_00);
      }
      return (Ifn_Ntk_t *)0x0;
    }
  }
  else {
    iVar1 = Ifn_NtkParseInt2(pStr,p_00);
    if (iVar1 == 0) {
      if (p_00 != (Ifn_Ntk_t *)0x0) {
        free(p_00);
      }
      return (Ifn_Ntk_t *)0x0;
    }
  }
  Ifn_NtkParseConstraints(pStr,p_00);
  Abc_TtElemInit2(p_00->pTtElems,p_00->nInps);
  return p_00;
}

Assistant:

Ifn_Ntk_t * Ifn_NtkParse( char * pStr )
{
    Ifn_Ntk_t * p = ABC_CALLOC( Ifn_Ntk_t, 1 );
    if ( Ifn_ManStrType2(pStr) )
    {
        if ( !Ifn_NtkParseInt2( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    else
    {
        if ( !Ifn_NtkParseInt( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    Ifn_NtkParseConstraints( pStr, p );
    Abc_TtElemInit2( p->pTtElems, p->nInps );
//    printf( "Finished parsing: " ); Ifn_NtkPrint(p);
    return p;
}